

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxDefaultRT<double>::selectEnter
          (SPxDefaultRT<double> *this,double *max,int param_2,bool param_3)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar6;
  double *pdVar7;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar8;
  long lVar9;
  double *pdVar10;
  undefined4 in_register_00000014;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  bool bVar13;
  ulong extraout_XMM0_Qb;
  double dVar14;
  SPxId enterId;
  uint local_e0;
  uint local_dc;
  double local_d8;
  DataKey local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  double local_88;
  ulong uStack_80;
  long local_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  double *local_38;
  
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,max,CONCAT44(in_register_00000014,param_2));
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x6b8) + 0x20));
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x6c0) + 0x20));
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_b8 = **(long **)(CONCAT44(extraout_var_01,iVar4) + 0x6c0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_70 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x6c0) + 0x40);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar9 = *(long *)(CONCAT44(extraout_var_03,iVar4) + 0x6c0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_a0 = **(long **)(CONCAT44(extraout_var_04,iVar4) + 0x6e0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_a8 = **(long **)(CONCAT44(extraout_var_05,iVar4) + 0x6d8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_06,iVar4) + 0x6b8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar4) + 0x6b8) + 0x40);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar2 = *(long *)(CONCAT44(extraout_var_08,iVar4) + 0x6b8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_90 = **(long **)(CONCAT44(extraout_var_09,iVar4) + 0x6f0);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_98 = **(long **)(CONCAT44(extraout_var_10,iVar4) + 0x6e8);
  iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_88 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_11,iVar4) + 0x1b8));
  local_d8 = *max;
  local_c0.info = 0;
  local_c0.idx = -1;
  uStack_80 = extraout_XMM0_Qb;
  local_38 = max;
  if (local_d8 <= 0.0) {
    local_dc = 0xffffffff;
    if (*(int *)(lVar9 + 0x28) < 1) {
      local_e0 = 0xffffffff;
    }
    else {
      local_58 = -local_88;
      uStack_50 = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_68 = *(double *)(in_FS_OFFSET + -8);
      uStack_60 = 0;
      local_48 = -local_68;
      uStack_40 = 0x8000000000000000;
      local_e0 = 0xffffffff;
      lVar11 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar9 + 0x30) + lVar11 * 4);
        lVar12 = (long)iVar4;
        dVar1 = *(double *)(local_70 + lVar12 * 8);
        if (dVar1 <= local_88) {
          if ((dVar1 < local_58) &&
             (dVar14 = *(double *)(local_a8 + lVar12 * 8), ::soplex::infinity::__tls_init(),
             dVar14 < local_68)) {
            dVar14 = (*(double *)(local_a8 + lVar12 * 8) - *(double *)(local_b8 + lVar12 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_0021159c;
          }
        }
        else {
          dVar14 = *(double *)(local_a0 + lVar12 * 8);
          ::soplex::infinity::__tls_init();
          if (local_48 < dVar14) {
            dVar14 = (*(double *)(local_a0 + lVar12 * 8) - *(double *)(local_b8 + lVar12 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
LAB_0021159c:
            if (local_d8 < dVar14 / dVar1) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_c0 = (DataKey)SPxSolverBase<double>::id
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_13,iVar5),iVar4);
              local_e0 = (uint)lVar11;
              local_d8 = dVar14 / dVar1;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(int *)(lVar9 + 0x28));
    }
    if (0 < *(int *)(lVar2 + 0x28)) {
      local_58 = -local_88;
      uStack_50 = uStack_80 ^ 0x8000000000000000;
      local_68 = *(double *)(in_FS_OFFSET + -8);
      uStack_60 = 0;
      local_48 = -local_68;
      uStack_40 = 0x8000000000000000;
      local_dc = 0xffffffff;
      lVar11 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar2 + 0x30) + lVar11 * 4);
        lVar12 = (long)iVar4;
        dVar1 = *(double *)(lVar6 + lVar12 * 8);
        if (dVar1 <= local_88) {
          if ((dVar1 < local_58) &&
             (dVar14 = *(double *)(local_98 + lVar12 * 8), ::soplex::infinity::__tls_init(),
             dVar14 < local_68)) {
            dVar14 = (*(double *)(local_98 + lVar12 * 8) - *(double *)(local_b0 + lVar12 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_002118cd;
          }
        }
        else {
          dVar14 = *(double *)(local_90 + lVar12 * 8);
          ::soplex::infinity::__tls_init();
          if (local_48 < dVar14) {
            dVar14 = (*(double *)(local_90 + lVar12 * 8) - *(double *)(local_b0 + lVar12 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
LAB_002118cd:
            if (local_d8 < dVar14 / dVar1) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_c0 = (DataKey)SPxSolverBase<double>::coId
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_15,iVar5),iVar4);
              local_dc = (uint)lVar11;
              local_d8 = dVar14 / dVar1;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(int *)(lVar2 + 0x28));
    }
    if ((int)local_dc < 0) {
      if ((int)local_e0 < 0) goto LAB_002119c4;
      lVar9 = (long)*(int *)(*(long *)(lVar9 + 0x30) + (ulong)local_e0 * 4);
      local_d8 = *(double *)(local_70 + lVar9 * 8);
      bVar3 = local_88 == local_d8;
      bVar13 = local_88 < local_d8;
      goto LAB_0021199a;
    }
    lVar9 = (long)*(int *)(*(long *)(lVar2 + 0x30) + (ulong)local_dc * 4);
    local_d8 = *(double *)(lVar6 + lVar9 * 8);
    bVar3 = local_88 == local_d8;
    bVar13 = local_88 < local_d8;
LAB_00211932:
    lVar6 = local_90;
    if (!bVar13 && !bVar3) {
      lVar6 = local_98;
    }
    pdVar7 = (double *)(lVar6 + lVar9 * 8);
    pdVar10 = (double *)(local_b0 + lVar9 * 8);
  }
  else {
    local_dc = 0xffffffff;
    if (*(int *)(lVar9 + 0x28) < 1) {
      local_e0 = 0xffffffff;
    }
    else {
      local_48 = -local_88;
      uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_58 = *(double *)(in_FS_OFFSET + -8);
      uStack_50 = 0;
      local_68 = -local_58;
      uStack_60 = 0x8000000000000000;
      local_e0 = 0xffffffff;
      lVar11 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar9 + 0x30) + lVar11 * 4);
        lVar12 = (long)iVar4;
        dVar1 = *(double *)(local_70 + lVar12 * 8);
        if (dVar1 <= local_88) {
          if ((dVar1 < local_48) &&
             (dVar14 = *(double *)(local_a0 + lVar12 * 8), ::soplex::infinity::__tls_init(),
             local_68 < dVar14)) {
            dVar14 = (*(double *)(local_a0 + lVar12 * 8) - *(double *)(local_b8 + lVar12 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_00211411;
          }
        }
        else {
          dVar14 = *(double *)(local_a8 + lVar12 * 8);
          ::soplex::infinity::__tls_init();
          if (dVar14 < local_58) {
            dVar14 = (*(double *)(local_a8 + lVar12 * 8) - *(double *)(local_b8 + lVar12 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
LAB_00211411:
            if (dVar14 / dVar1 < local_d8) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_c0 = (DataKey)SPxSolverBase<double>::id
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_12,iVar5),iVar4);
              local_e0 = (uint)lVar11;
              local_d8 = dVar14 / dVar1;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(int *)(lVar9 + 0x28));
    }
    if (0 < *(int *)(lVar2 + 0x28)) {
      local_48 = -local_88;
      uStack_40 = uStack_80 ^ 0x8000000000000000;
      local_58 = *(double *)(in_FS_OFFSET + -8);
      uStack_50 = 0;
      local_68 = -local_58;
      uStack_60 = 0x8000000000000000;
      local_dc = 0xffffffff;
      lVar11 = 0;
      do {
        iVar4 = *(int *)(*(long *)(lVar2 + 0x30) + lVar11 * 4);
        lVar12 = (long)iVar4;
        dVar1 = *(double *)(lVar6 + lVar12 * 8);
        if (dVar1 <= local_88) {
          if ((dVar1 < local_48) &&
             (dVar14 = *(double *)(local_90 + lVar12 * 8), ::soplex::infinity::__tls_init(),
             local_68 < dVar14)) {
            dVar14 = (*(double *)(local_90 + lVar12 * 8) - *(double *)(local_b0 + lVar12 * 8)) -
                     (this->super_SPxRatioTester<double>).delta;
            goto LAB_00211720;
          }
        }
        else {
          dVar14 = *(double *)(local_98 + lVar12 * 8);
          ::soplex::infinity::__tls_init();
          if (dVar14 < local_58) {
            dVar14 = (*(double *)(local_98 + lVar12 * 8) - *(double *)(local_b0 + lVar12 * 8)) +
                     (this->super_SPxRatioTester<double>).delta;
LAB_00211720:
            if (dVar14 / dVar1 < local_d8) {
              iVar5 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              local_c0 = (DataKey)SPxSolverBase<double>::coId
                                            ((SPxSolverBase<double> *)
                                             CONCAT44(extraout_var_14,iVar5),iVar4);
              local_dc = (uint)lVar11;
              local_d8 = dVar14 / dVar1;
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < *(int *)(lVar2 + 0x28));
    }
    if (-1 < (int)local_dc) {
      lVar9 = (long)*(int *)(*(long *)(lVar2 + 0x30) + (ulong)local_dc * 4);
      local_d8 = *(double *)(lVar6 + lVar9 * 8);
      bVar3 = local_d8 == local_88;
      bVar13 = local_d8 < local_88;
      goto LAB_00211932;
    }
    if ((int)local_e0 < 0) goto LAB_002119c4;
    lVar9 = (long)*(int *)(*(long *)(lVar9 + 0x30) + (ulong)local_e0 * 4);
    local_d8 = *(double *)(local_70 + lVar9 * 8);
    bVar3 = local_d8 == local_88;
    bVar13 = local_d8 < local_88;
LAB_0021199a:
    lVar6 = local_a0;
    if (!bVar13 && !bVar3) {
      lVar6 = local_a8;
    }
    pdVar7 = (double *)(lVar6 + lVar9 * 8);
    pdVar10 = (double *)(local_b8 + lVar9 * 8);
  }
  local_d8 = (*pdVar7 - *pdVar10) / local_d8;
LAB_002119c4:
  if (local_c0.info != 0) {
    iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
    bVar3 = SPxSolverBase<double>::isBasic
                      ((SPxSolverBase<double> *)CONCAT44(extraout_var_16,iVar4),(SPxId *)&local_c0);
    if (bVar3) {
      lVar9 = 0x6b8;
      if ((-1 < (int)local_dc) || (lVar9 = 0x6c0, local_dc = local_e0, -1 < (int)local_e0)) {
        iVar4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        lVar9 = *(long *)(CONCAT44(extraout_var_17,iVar4) + lVar9);
        lVar6 = *(long *)(lVar9 + 0x30);
        *(undefined8 *)(*(long *)(lVar9 + 0x40) + (long)*(int *)(lVar6 + (ulong)local_dc * 4) * 8) =
             0;
        iVar4 = *(int *)(lVar9 + 0x28);
        *(int *)(lVar9 + 0x28) = iVar4 + -1;
        *(undefined4 *)(lVar6 + (ulong)local_dc * 4) = *(undefined4 *)(lVar6 + -4 + (long)iVar4 * 4)
        ;
      }
      DVar8 = (DataKey)selectEnter(this,local_38,0,false);
      return (SPxId)DVar8;
    }
  }
  *local_38 = local_d8;
  return (SPxId)local_c0;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}